

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft.c
# Opt level: O1

void sigframp_dsp(t_sigframp *x,t_signal **sp)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (*sp)->s_n;
  if ((int)uVar1 < 4) {
    pd_error((void *)0x0,"framp: minimum 4 points");
    return;
  }
  uVar2 = (ulong)(uVar1 >> 1);
  dsp_add(sigframp_perform,5,(*sp)->s_vec,sp[1]->s_vec,sp[2]->s_vec,sp[3]->s_vec,uVar2);
  dsp_add(sigsqrt_perform,3,sp[3]->s_vec,sp[3]->s_vec,uVar2);
  return;
}

Assistant:

static void sigframp_dsp(t_sigframp *x, t_signal **sp)
{
    int n = sp[0]->s_n, n2 = (n>>1);
    if (n < 4)
    {
        pd_error(0, "framp: minimum 4 points");
        return;
    }
    dsp_add(sigframp_perform, 5, sp[0]->s_vec, sp[1]->s_vec,
        sp[2]->s_vec, sp[3]->s_vec, (t_int)n2);
    dsp_add(sigsqrt_perform, 3, sp[3]->s_vec, sp[3]->s_vec, (t_int)n2);
}